

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O2

int __thiscall
Decrypt::decrypt(Decrypt *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  DESinv d2;
  DES c;
  DESinv d1;
  SequenceD<64> local_4e0;
  SequenceD<64> local_430;
  SequenceD<64> local_380;
  SequenceD<64> local_2d0;
  SequenceD<64> local_220;
  SequenceD<64> local_170;
  SequenceD<64> local_c0;
  
  SequenceD<64>::SequenceD(&local_c0,&this->m_k1);
  SequenceD<64>::SequenceD(&local_170,(SequenceD<64> *)ctx);
  DESinv::operator()(&local_430,(DESinv *)&local_c0,&local_170);
  SequenceD<64>::operator=((SequenceD<64> *)ctx,&local_430);
  SequenceD<64>::~SequenceD(&local_430);
  SequenceD<64>::~SequenceD(&local_170);
  SequenceD<64>::SequenceD(&local_430,&this->m_k2);
  SequenceD<64>::SequenceD(&local_220,(SequenceD<64> *)ctx);
  DES::operator()(&local_4e0,(DES *)&local_430,&local_220);
  SequenceD<64>::operator=((SequenceD<64> *)ctx,&local_4e0);
  SequenceD<64>::~SequenceD(&local_4e0);
  SequenceD<64>::~SequenceD(&local_220);
  SequenceD<64>::SequenceD(&local_4e0,&this->m_k1);
  SequenceD<64>::SequenceD(&local_380,(SequenceD<64> *)ctx);
  DESinv::operator()(&local_2d0,(DESinv *)&local_4e0,&local_380);
  SequenceD<64>::operator=((SequenceD<64> *)ctx,&local_2d0);
  SequenceD<64>::~SequenceD(&local_2d0);
  SequenceD<64>::~SequenceD(&local_380);
  SequenceD<64>::~SequenceD(&local_4e0);
  SequenceD<64>::~SequenceD(&local_430);
  SequenceD<64>::~SequenceD(&local_c0);
  return (int)ctx;
}

Assistant:

SequenceD<64> &Decrypt::decrypt(SequenceD<64> &seq) {
    DESinv d1(m_k1);
    seq = d1(seq);
    DES c(m_k2);
    seq = c(seq);
    DESinv d2(m_k1);
    seq = d2(seq);
    return seq;
}